

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNewLineStyle.cxx
# Opt level: O3

bool __thiscall
cmNewLineStyle::ReadFromArguments
          (cmNewLineStyle *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errorString)

{
  byte bVar1;
  int iVar2;
  ulong in_RAX;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  pointer pbVar7;
  char *pcVar8;
  bool bVar9;
  
  this->NewLineStyle = Invalid;
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = 1;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
    lVar4 = 0x20;
    uVar6 = 1;
    do {
      iVar2 = std::__cxx11::string::compare((char *)((long)&pbVar7[-1]._M_dataplus._M_p + lVar4));
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5;
      if (iVar2 == 0) {
        if (uVar6 < uVar3) {
          pcVar8 = (char *)((long)&(pbVar7->_M_dataplus)._M_p + lVar4);
          iVar2 = std::__cxx11::string::compare(pcVar8);
          if (iVar2 == 0) {
LAB_001df050:
            this->NewLineStyle = LF;
          }
          else {
            iVar2 = std::__cxx11::string::compare(pcVar8);
            if (iVar2 == 0) goto LAB_001df050;
            iVar2 = std::__cxx11::string::compare(pcVar8);
            if (iVar2 != 0) {
              iVar2 = std::__cxx11::string::compare(pcVar8);
              if (iVar2 != 0) {
                iVar2 = std::__cxx11::string::compare(pcVar8);
                if (iVar2 != 0) {
                  std::__cxx11::string::operator=
                            ((string *)errorString,
                             "NEWLINE_STYLE sets an unknown style, only LF, CRLF, UNIX, DOS, and WIN32 are supported"
                            );
                  goto LAB_001df04c;
                }
              }
            }
            this->NewLineStyle = CRLF;
          }
          bVar1 = 1;
          bVar5 = 0;
        }
        else {
          std::__cxx11::string::_M_replace
                    ((ulong)errorString,0,(char *)errorString->_M_string_length,0x53f862);
LAB_001df04c:
          bVar5 = 0;
          bVar1 = 0;
        }
        goto LAB_001df06d;
      }
      lVar4 = lVar4 + 0x20;
      in_RAX = uVar6 + 1;
      bVar9 = uVar6 < uVar3;
      uVar6 = in_RAX;
    } while (bVar9);
  }
  bVar1 = (byte)in_RAX;
LAB_001df06d:
  return (bool)(bVar5 | bVar1 & 1);
}

Assistant:

bool cmNewLineStyle::ReadFromArguments(const std::vector<std::string>& args,
                                       std::string& errorString)
{
  NewLineStyle = Invalid;

  for (size_t i = 0; i < args.size(); i++) {
    if (args[i] == "NEWLINE_STYLE") {
      size_t const styleIndex = i + 1;
      if (args.size() > styleIndex) {
        std::string const& eol = args[styleIndex];
        if (eol == "LF" || eol == "UNIX") {
          NewLineStyle = LF;
          return true;
        }
        if (eol == "CRLF" || eol == "WIN32" || eol == "DOS") {
          NewLineStyle = CRLF;
          return true;
        }
        errorString = "NEWLINE_STYLE sets an unknown style, only LF, "
                      "CRLF, UNIX, DOS, and WIN32 are supported";
        return false;
      }
      errorString = "NEWLINE_STYLE must set a style: "
                    "LF, CRLF, UNIX, DOS, or WIN32";
      return false;
    }
  }
  return true;
}